

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::visitProFile(QMakeEvaluator *this,ProFile *pro,EvalFileType type,LoadFlags flags)

{
  QStack<ProFile_*> *this_00;
  byte bVar1;
  Data *pDVar2;
  long lVar3;
  QMakeGlobals *pQVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  ProString *pPVar7;
  qsizetype qVar8;
  bool bVar9;
  VisitReturn VVar10;
  long *plVar11;
  QMakeEvaluator *pQVar12;
  ProStringList *pPVar13;
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar14;
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar15;
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar16;
  char16_t *pcVar17;
  long lVar18;
  VisitReturn VVar19;
  undefined8 *puVar20;
  ProFile *pPVar21;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QString local_f8;
  QArrayDataPointer<ProString> local_d8;
  QArrayDataPointer<ProString> local_b8;
  ProKey local_a0;
  QMakeBaseKey local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  VVar19 = ReturnFalse;
  if (pro->m_ok != true) goto LAB_002866fc;
  if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
             super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 1) == 0) {
    if (this->m_valuemapInited == false) {
      loadDefaults(this);
    }
  }
  else {
    pQVar5 = &((pro->m_directoryName).d.d)->super_QArrayData;
    local_70.root.d.ptr = (pro->m_directoryName).d.ptr;
    local_70.root.d.size = (pro->m_directoryName).d.size;
    local_70.root.d.d = (Data *)pQVar5;
    if (pQVar5 == (QArrayData *)0x0) {
      prepareProject(this,&local_70.root);
    }
    else {
      LOCK();
      (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      prepareProject(this,&local_70.root);
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_70.hostBuild = pro->m_hostBuild;
    this->m_hostBuild = local_70.hostBuild;
    pQVar4 = this->m_option;
    local_70.root.d.d = (this->m_buildRoot).d.d;
    local_70.root.d.ptr = (this->m_buildRoot).d.ptr;
    local_70.root.d.size = (this->m_buildRoot).d.size;
    if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
      LOCK();
      (((ProFile *)local_70.root.d.d)->m_refCount).m_cnt =
           (((ProFile *)local_70.root.d.d)->m_refCount).m_cnt + 1;
      UNLOCK();
    }
    local_70.stash.d.d = (this->m_stashfile).d.d;
    local_70.stash.d.ptr = (this->m_stashfile).d.ptr;
    local_70.stash.d.size = (this->m_stashfile).d.size;
    if (&(local_70.stash.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_70.stash.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_70.stash.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QHash<QMakeBaseKey,QMakeBaseEnv*>::tryEmplace_impl<QMakeBaseKey_const&>
              ((TryEmplaceResult *)&local_a0,&pQVar4->baseEnvs,&local_70);
    pDVar2 = (((QString *)((long)local_a0.super_ProString.m_string.d.d + 0x20))->d).d;
    lVar3 = *(long *)&pDVar2[((ulong)local_a0.super_ProString.m_string.d.ptr >> 7) * 9 + 8].
                      super_QArrayData;
    bVar1 = *(byte *)((long)&pDVar2[((ulong)local_a0.super_ProString.m_string.d.ptr >> 7) * 9].
                             super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i +
                     (ulong)((uint)local_a0.super_ProString.m_string.d.ptr & 0x7f));
    if (&(local_70.stash.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_70.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_70.stash.d.d)->super_QArrayData,2,0x10);
      }
    }
    puVar20 = (undefined8 *)(lVar3 + (ulong)bVar1 * 0x40 + 0x38);
    if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
      LOCK();
      ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
           ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
      UNLOCK();
      if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
        QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
      }
    }
    plVar11 = (long *)*puVar20;
    if (plVar11 == (long *)0x0) {
      plVar11 = (long *)operator_new(8);
      *plVar11 = 0;
      *puVar20 = plVar11;
    }
    pQVar12 = (QMakeEvaluator *)*plVar11;
    if (pQVar12 == (QMakeEvaluator *)0x0) {
      pQVar12 = (QMakeEvaluator *)operator_new(0x2b0);
      QMakeEvaluator(pQVar12,this->m_option,this->m_parser,this->m_vfs,this->m_handler);
      *plVar11 = (long)pQVar12;
      QString::operator=(&pQVar12->m_superfile,(QString *)&this->m_superfile);
      QString::operator=(&pQVar12->m_conffile,(QString *)&this->m_conffile);
      QString::operator=(&pQVar12->m_cachefile,(QString *)&this->m_cachefile);
      QString::operator=(&pQVar12->m_stashfile,(QString *)&this->m_stashfile);
      QString::operator=(&pQVar12->m_sourceRoot,(QString *)&this->m_sourceRoot);
      QString::operator=(&pQVar12->m_buildRoot,(QString *)&this->m_buildRoot);
      pQVar12->m_hostBuild = this->m_hostBuild;
      bVar9 = loadSpec(pQVar12);
      VVar19 = ReturnFalse;
      if (!bVar9) goto LAB_002866fc;
      pQVar12 = (QMakeEvaluator *)*plVar11;
    }
    initFrom(this,pQVar12);
  }
  lVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if (lVar3 == 0) {
    pPVar21 = (ProFile *)0x0;
  }
  else {
    pPVar21 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar3 + -1];
  }
  (**(code **)(*(long *)this->m_handler + 0x10))(this->m_handler,pPVar21,pro,type);
  this_00 = &this->m_profileStack;
  local_70.root.d.d = (Data *)pro;
  QtPrivate::QPodArrayOps<ProFile*>::emplace<ProFile*&>
            ((QPodArrayOps<ProFile*> *)this_00,(this->m_profileStack).super_QList<ProFile_*>.d.size,
             (ProFile **)&local_70);
  QList<ProFile_*>::end(&this_00->super_QList<ProFile_*>);
  lVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if ((lVar3 == 0) ||
     (pPVar21 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar3 + -1],
     pPVar21 == (ProFile *)0x0)) {
    local_f8.d.d = (Data *)0x0;
    local_f8.d.ptr = (char16_t *)0x0;
    local_f8.d.size = 0;
  }
  else {
    local_f8.d.d = (pPVar21->m_directoryName).d.d;
    local_f8.d.ptr = (pPVar21->m_directoryName).d.ptr;
    local_f8.d.size = (pPVar21->m_directoryName).d.size;
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ProString::ProString((ProString *)&local_70,&local_f8);
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_d8,0,(ProString *)&local_70);
  QList<ProString>::end((QList<ProString> *)&local_d8);
  ProKey::ProKey(&local_a0,"PWD");
  pPVar13 = valuesRef(this,&local_a0);
  qVar8 = local_d8.size;
  pPVar7 = local_d8.ptr;
  pDVar6 = local_d8.d;
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  local_b8.d = (pPVar13->super_QList<ProString>).d.d;
  local_b8.ptr = (pPVar13->super_QList<ProString>).d.ptr;
  (pPVar13->super_QList<ProString>).d.d = pDVar6;
  (pPVar13->super_QList<ProString>).d.ptr = pPVar7;
  local_b8.size = (pPVar13->super_QList<ProString>).d.size;
  (pPVar13->super_QList<ProString>).d.size = qVar8;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_b8);
  if ((ProFile *)local_a0.super_ProString.m_string.d.d != (ProFile *)0x0) {
    LOCK();
    ((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt =
         ((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt + -1
    ;
    UNLOCK();
    if (((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt == 0)
    {
      QArrayData::deallocate(&(local_a0.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
    LOCK();
    ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
         ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
    UNLOCK();
    if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
      QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
             super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 1) == 0) {
LAB_002862b7:
    if (this->m_debugLevel != 0) {
      pQVar5 = &((pro->m_fileName).d.d)->super_QArrayData;
      pcVar17 = (pro->m_fileName).d.ptr;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)pcVar17);
      pcVar17 = local_70.root.d.ptr;
      if (local_70.root.d.ptr == (char16_t *)0x0) {
        pcVar17 = (char16_t *)&QByteArray::_empty;
      }
      debugMsgInternal(this,1,"visiting file %s",pcVar17);
      if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
        LOCK();
        ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
             ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
        UNLOCK();
        if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
          QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
    }
    pcVar17 = (pro->m_proitems).d.ptr;
    if (pcVar17 == (char16_t *)0x0) {
      pcVar17 = (char16_t *)&QString::_empty;
    }
    (this->m_current).pro = pro;
    (this->m_current).line = 0;
    VVar10 = visitProBlock(this,(ushort *)pcVar17);
    VVar19 = ReturnError;
    if (VVar10 != ReturnError) {
      if (this->m_debugLevel != 0) {
        pQVar5 = &((pro->m_fileName).d.d)->super_QArrayData;
        pcVar17 = (pro->m_fileName).d.ptr;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)pcVar17);
        pcVar17 = local_70.root.d.ptr;
        if (local_70.root.d.ptr == (char16_t *)0x0) {
          pcVar17 = (char16_t *)&QByteArray::_empty;
        }
        debugMsgInternal(this,1,"done visiting file %s",pcVar17);
        if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
          LOCK();
          ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
               ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
          UNLOCK();
          if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
            QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
      }
      if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
                 super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 2) == 0) {
LAB_00286428:
        VVar19 = ReturnTrue;
      }
      else {
        pQVar4 = this->m_option;
        QVar25.m_data = (storage_type *)0x15;
        QVar25.m_size = (qsizetype)&local_70;
        QString::fromLatin1(QVar25);
        evaluateCommand(this,pQVar4->extra_cmds + 2,&local_70.root);
        if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
          LOCK();
          ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
               ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
          UNLOCK();
          if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
            QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
          }
        }
        applyExtraConfigs(this);
        QVar26.m_data = (storage_type *)0x10;
        QVar26.m_size = (qsizetype)&local_70;
        QString::fromLatin1(QVar26);
        pDVar2 = local_70.root.d.d;
        local_a0.super_ProString.m_string.d.d = local_70.root.d.d;
        local_a0.super_ProString.m_string.d.ptr = local_70.root.d.ptr;
        local_a0.super_ProString.m_string.d.size = local_70.root.d.size;
        VVar10 = evaluateFeatureFile(this,(QString *)&local_a0,false);
        if ((ProFile *)pDVar2 != (ProFile *)0x0) {
          LOCK();
          ((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt =
               ((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt + -1;
          UNLOCK();
          if (((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt == 0) {
            QArrayData::deallocate
                      (&(local_a0.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (VVar10 != ReturnError) {
          pQVar4 = this->m_option;
          if (pQVar4->extra_cmds[3].d.size != 0) {
            QVar27.m_data = (storage_type *)0x14;
            QVar27.m_size = (qsizetype)&local_70;
            QString::fromLatin1(QVar27);
            evaluateCommand(this,pQVar4->extra_cmds + 3,&local_70.root);
            if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
              LOCK();
              ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
                   ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
              UNLOCK();
              if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
                QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          VVar10 = evaluateConfigFeatures(this);
          if (VVar10 != ReturnError) goto LAB_00286428;
        }
      }
    }
  }
  else {
    setupProject(this);
    pQVar4 = this->m_option;
    if (pQVar4->extra_cmds[0].d.size != 0) {
      QVar22.m_data = (storage_type *)0x15;
      QVar22.m_size = (qsizetype)&local_70;
      QString::fromLatin1(QVar22);
      evaluateCommand(this,pQVar4->extra_cmds,&local_70.root);
      if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
        LOCK();
        ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
             ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
        UNLOCK();
        if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
          QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    pQVar15 = (this->m_extraVars).d.d.ptr;
    if (pQVar15 ==
        (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)0x0) {
      pQVar14 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                 *)0x0;
    }
    else {
      pQVar14 = *(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                  **)((long)&(pQVar15->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    pQVar16 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
               *)&(pQVar15->m)._M_t._M_impl.super__Rb_tree_header;
    if (pQVar15 ==
        (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)0x0) {
      pQVar16 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                 *)0x0;
    }
    if (pQVar14 != pQVar16) {
      do {
        QMap<ProKey,_ProStringList>::insert
                  ((QMap<ProKey,_ProStringList> *)
                   ((this->m_valuemapStack).
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    .
                    super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next + 1),
                   (ProKey *)&(pQVar14->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (ProStringList *)
                   &pQVar14[1].m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        pQVar14 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                   *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar14);
        pQVar15 = (this->m_extraVars).d.d.ptr;
        if (pQVar15 !=
            (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
             *)0x0) {
          pQVar15 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                     *)&(pQVar15->m)._M_t._M_impl.super__Rb_tree_header;
        }
      } while (pQVar14 != pQVar15);
    }
    applyExtraConfigs(this);
    QVar23.m_data = (storage_type *)0xf;
    QVar23.m_size = (qsizetype)&local_70;
    QString::fromLatin1(QVar23);
    pDVar2 = local_70.root.d.d;
    local_a0.super_ProString.m_string.d.d = local_70.root.d.d;
    local_a0.super_ProString.m_string.d.ptr = local_70.root.d.ptr;
    local_a0.super_ProString.m_string.d.size = local_70.root.d.size;
    VVar10 = evaluateFeatureFile(this,(QString *)&local_a0,false);
    if ((ProFile *)pDVar2 != (ProFile *)0x0) {
      LOCK();
      ((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt =
           ((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt + -1;
      UNLOCK();
      if (((ProItemRefCount *)&pDVar2->super_QArrayData)->m_cnt == 0) {
        QArrayData::deallocate(&(local_a0.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    VVar19 = ReturnError;
    if (VVar10 != ReturnError) {
      pQVar4 = this->m_option;
      if (pQVar4->extra_cmds[1].d.size != 0) {
        QVar24.m_data = (storage_type *)0xe;
        QVar24.m_size = (qsizetype)&local_70;
        QString::fromLatin1(QVar24);
        evaluateCommand(this,pQVar4->extra_cmds + 1,&local_70.root);
        if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
          LOCK();
          ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
               ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
          UNLOCK();
          if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
            QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
          }
        }
        applyExtraConfigs(this);
      }
      goto LAB_002862b7;
    }
  }
  QList<ProFile_*>::end(&this_00->super_QList<ProFile_*>);
  lVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  lVar18 = lVar3 + -1;
  (this->m_profileStack).super_QList<ProFile_*>.d.size = lVar18;
  if ((lVar18 == 0) ||
     (pPVar21 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar3 + -2],
     pPVar21 == (ProFile *)0x0)) {
    local_f8.d.d = (Data *)0x0;
    local_f8.d.ptr = (char16_t *)0x0;
    local_f8.d.size = 0;
  }
  else {
    local_f8.d.d = (pPVar21->m_directoryName).d.d;
    local_f8.d.ptr = (pPVar21->m_directoryName).d.ptr;
    local_f8.d.size = (pPVar21->m_directoryName).d.size;
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ProString::ProString((ProString *)&local_70,&local_f8);
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_d8,0,(ProString *)&local_70);
  QList<ProString>::end((QList<ProString> *)&local_d8);
  ProKey::ProKey(&local_a0,"PWD");
  pPVar13 = valuesRef(this,&local_a0);
  qVar8 = local_d8.size;
  pPVar7 = local_d8.ptr;
  pDVar6 = local_d8.d;
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  local_b8.d = (pPVar13->super_QList<ProString>).d.d;
  local_b8.ptr = (pPVar13->super_QList<ProString>).d.ptr;
  (pPVar13->super_QList<ProString>).d.d = pDVar6;
  (pPVar13->super_QList<ProString>).d.ptr = pPVar7;
  local_b8.size = (pPVar13->super_QList<ProString>).d.size;
  (pPVar13->super_QList<ProString>).d.size = qVar8;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_b8);
  if ((ProFile *)local_a0.super_ProString.m_string.d.d != (ProFile *)0x0) {
    LOCK();
    ((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt =
         ((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt + -1
    ;
    UNLOCK();
    if (((ProItemRefCount *)&(local_a0.super_ProString.m_string.d.d)->super_QArrayData)->m_cnt == 0)
    {
      QArrayData::deallocate(&(local_a0.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  if ((ProFile *)local_70.root.d.d != (ProFile *)0x0) {
    LOCK();
    ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt =
         ((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt + -1;
    UNLOCK();
    if (((ProItemRefCount *)&(local_70.root.d.d)->super_QArrayData)->m_cnt == 0) {
      QArrayData::deallocate(&(local_70.root.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if (lVar3 == 0) {
    pPVar21 = (ProFile *)0x0;
  }
  else {
    pPVar21 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar3 + -1];
  }
  (**(code **)(*(long *)this->m_handler + 0x18))(this->m_handler,pPVar21);
LAB_002866fc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar19;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProFile(
        ProFile *pro, QMakeHandler::EvalFileType type, LoadFlags flags)
{
    if (!m_cumulative && !pro->isOk())
        return ReturnFalse;

    if (flags & LoadPreFiles) {
        if (!prepareProject(pro->directoryName()))
            return ReturnFalse;

        m_hostBuild = pro->isHostBuild();

#ifdef PROEVALUATOR_THREAD_SAFE
        m_option->mutex.lock();
#endif
        QMakeBaseEnv **baseEnvPtr = &m_option->baseEnvs[QMakeBaseKey(m_buildRoot, m_stashfile, m_hostBuild)];
        if (!*baseEnvPtr)
            *baseEnvPtr = new QMakeBaseEnv;
        QMakeBaseEnv *baseEnv = *baseEnvPtr;

#ifdef PROEVALUATOR_THREAD_SAFE
        QMutexLocker locker(&baseEnv->mutex);
        m_option->mutex.unlock();
        if (baseEnv->inProgress) {
            QThreadPool::globalInstance()->releaseThread();
            baseEnv->cond.wait(&baseEnv->mutex);
            QThreadPool::globalInstance()->reserveThread();
            if (!baseEnv->isOk)
                return ReturnFalse;
        } else
#endif
        if (!baseEnv->evaluator) {
#ifdef PROEVALUATOR_THREAD_SAFE
            baseEnv->inProgress = true;
            locker.unlock();
#endif

            QMakeEvaluator *baseEval = new QMakeEvaluator(m_option, m_parser, m_vfs, m_handler);
            baseEnv->evaluator = baseEval;
            baseEval->m_superfile = m_superfile;
            baseEval->m_conffile = m_conffile;
            baseEval->m_cachefile = m_cachefile;
            baseEval->m_stashfile = m_stashfile;
            baseEval->m_sourceRoot = m_sourceRoot;
            baseEval->m_buildRoot = m_buildRoot;
            baseEval->m_hostBuild = m_hostBuild;
            bool ok = baseEval->loadSpec();

#ifdef PROEVALUATOR_THREAD_SAFE
            locker.relock();
            baseEnv->isOk = ok;
            baseEnv->inProgress = false;
            baseEnv->cond.wakeAll();
#endif

            if (!ok)
                return ReturnFalse;
        }
#ifdef PROEVALUATOR_THREAD_SAFE
        else if (!baseEnv->isOk)
            return ReturnFalse;
#endif

        initFrom(baseEnv->evaluator);
    } else {
        if (!m_valuemapInited)
            loadDefaults();
    }

    VisitReturn vr;

    m_handler->aboutToEval(currentProFile(), pro, type);
    m_profileStack.push(pro);
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    if (flags & LoadPreFiles) {
        setupProject();

        if (!m_option->extra_cmds[QMakeEvalEarly].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalEarly], fL1S("(command line -early)"));

        for (ProValueMap::ConstIterator it = m_extraVars.constBegin();
             it != m_extraVars.constEnd(); ++it)
            m_valuemapStack.front().insert(it.key(), it.value());

        // In case default_pre needs to make decisions based on the current
        // build pass configuration.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_pre.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalBefore].isEmpty()) {
            evaluateCommand(m_option->extra_cmds[QMakeEvalBefore], fL1S("(command line)"));

            // Again, after user configs, to override them
            applyExtraConfigs();
        }
    }

    debugMsg(1, "visiting file %s", qPrintable(pro->fileName()));
    if ((vr = visitProBlock(pro, pro->tokPtr())) == ReturnError)
        goto failed;
    debugMsg(1, "done visiting file %s", qPrintable(pro->fileName()));

    if (flags & LoadPostFiles) {
        evaluateCommand(m_option->extra_cmds[QMakeEvalAfter], fL1S("(command line -after)"));

        // Again, to ensure the project does not mess with us.
        // Specifically, do not allow a project to override debug/release within a
        // debug_and_release build pass - it's too late for that at this point anyway.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_post.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalLate].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalLate], fL1S("(command line -late)"));

        if ((vr = evaluateConfigFeatures()) == ReturnError)
            goto failed;
    }
    vr = ReturnTrue;
  failed:
    m_profileStack.pop();
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    m_handler->doneWithEval(currentProFile());

    return vr;
}